

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearSpeed.h
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearSpeed::SetSpeedFunction
          (ChLinkMotorLinearSpeed *this,shared_ptr<chrono::ChFunction> *function)

{
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&function->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChLinkMotorLinear).super_ChLinkMotor.m_func.
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void SetSpeedFunction(const std::shared_ptr<ChFunction> function) { SetMotorFunction(function); }